

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger thread_wakeupthrow(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue v_00;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  char *err;
  SQRESULT SStack_30;
  SQBool rethrow_error;
  SQObjectPtr o;
  
  pSVar2 = stack_get(v,1);
  o.super_SQObject._type = (pSVar2->super_SQObject)._type;
  v_00 = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pGenerator;
  if ((o.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  o.super_SQObject._unVal = v_00;
  if (o.super_SQObject._type == OT_THREAD) {
    SVar3 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
    if (SVar3 == 0) {
      err = "cannot wakeup a idle thread";
    }
    else {
      if (SVar3 != 1) {
        sq_move((HSQUIRRELVM)v_00.pTable,v,2);
        sq_throwobject((HSQUIRRELVM)v_00.pTable);
        rethrow_error = 1;
        SVar3 = sq_gettop(v);
        if (2 < SVar3) {
          sq_getbool(v,3,&rethrow_error);
        }
        SVar4 = sq_wakeupvm((HSQUIRRELVM)v_00.pTable,0,1,1,1);
        if (SVar4 < 0) {
          sq_settop((HSQUIRRELVM)v_00.pTable,1);
          if (rethrow_error == 0) {
            SStack_30 = 0;
          }
          else {
            SQObjectPtr::operator=(&v->_lasterror,&(v_00.pNativeClosure)->_name);
            SStack_30 = -1;
          }
        }
        else {
          sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
          SStack_30 = 1;
          sq_pop((HSQUIRRELVM)v_00.pTable,1);
          SVar3 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
          if (SVar3 == 0) {
            SStack_30 = 1;
            sq_settop((HSQUIRRELVM)v_00.pTable,1);
          }
        }
        goto LAB_0012bbba;
      }
      err = "cannot wakeup a running thread";
    }
    SStack_30 = sq_throwerror(v,err);
  }
  else {
    SStack_30 = sq_throwerror(v,"wrong parameter");
  }
LAB_0012bbba:
  SQObjectPtr::~SQObjectPtr(&o);
  return SStack_30;
}

Assistant:

static SQInteger thread_wakeupthrow(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        sq_move(thread,v,2);
        sq_throwobject(thread);
        SQBool rethrow_error = SQTrue;
        if(sq_gettop(v) > 2) {
            sq_getbool(v,3,&rethrow_error);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,SQFalse,SQTrue,SQTrue,SQTrue))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        if(rethrow_error) {
            v->_lasterror = thread->_lasterror;
            return SQ_ERROR;
        }
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}